

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O2

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::exportImportFunction
          (ModuleSplitter *this,Name funcName)

{
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *this_00;
  Config *pCVar1;
  Module *pMVar2;
  char *pcVar3;
  Name name;
  Name name_00;
  undefined1 auVar4 [8];
  size_t type;
  iterator iVar5;
  Export *pEVar6;
  string_view *psVar7;
  Function *pFVar8;
  _Rb_tree_header *p_Var9;
  Name root;
  Name value;
  string_view name_01;
  Name name_02;
  Name name_03;
  string_view local_b8;
  IString local_a8;
  MinifiedNameGenerator *local_98;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *local_90;
  _Alloc_hider local_88;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_40 [8];
  Name funcName_local;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  local_40 = funcName.super_IString.str._M_len;
  this_00 = &this->exportedPrimaryFuncs;
  iVar5 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::find(&this_00->_M_t,(key_type *)local_40);
  p_Var9 = &(this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar5._M_node == p_Var9) {
    pCVar1 = this->config;
    local_90 = this_00;
    if (pCVar1->minimizeNewExportNames == true) {
      local_98 = &this->minified;
      do {
        pCVar1 = this->config;
        Names::MinifiedNameGenerator::getName_abi_cxx11_
                  ((string *)&stack0xffffffffffffff78,local_98);
        std::operator+(&local_68,&pCVar1->newExportPrefix,(string *)&stack0xffffffffffffff78);
        IString::IString((IString *)&local_b8,&local_68);
        name_01 = local_b8;
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
        pEVar6 = Module::getExportOrNull(this->primary,(Name)name_01);
      } while (pEVar6 != (Export *)0x0);
    }
    else {
      pMVar2 = this->primary;
      IString::toString_abi_cxx11_((string *)&stack0xffffffffffffff78,(IString *)local_40);
      std::operator+(&local_68,&pCVar1->newExportPrefix,(string *)&stack0xffffffffffffff78);
      IString::IString(&local_a8,&local_68);
      root.super_IString.str._M_str = (char *)p_Var9;
      root.super_IString.str._M_len = (size_t)local_a8.str._M_str;
      name_01 = (string_view)
                Names::getValidExportName((Names *)pMVar2,(Module *)local_a8.str._M_len,root);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    }
    pMVar2 = this->primary;
    value.super_IString.str._M_str = (char *)local_40;
    value.super_IString.str._M_len = (size_t)name_01._M_str;
    name_02.super_IString.str._M_str = (char *)name_01._M_len;
    name_02.super_IString.str._M_len = (size_t)&local_68;
    Builder::makeExport(name_02,value,(ExternalKind)funcName_local.super_IString.str._M_len);
    Module::addExport(pMVar2,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                             &local_68);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
              ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_68);
    psVar7 = (string_view *)
             std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[](local_90,(key_type *)local_40);
    *psVar7 = name_01;
  }
  else {
    name_01._M_len = (size_t)iVar5._M_node[1]._M_left;
    name_01._M_str = (char *)iVar5._M_node[1]._M_right;
  }
  name.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)local_40;
  pFVar8 = Module::getFunctionOrNull(this->secondary,name);
  type = funcName_local.super_IString.str._M_len;
  auVar4 = local_40;
  if (pFVar8 == (Function *)0x0) {
    name_00.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)local_40;
    pFVar8 = Module::getFunction(this->primary,name_00);
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    name_03.super_IString.str._M_str = (char *)auVar4;
    name_03.super_IString.str._M_len = (size_t)&stack0xffffffffffffff78;
    Builder::makeFunction
              (name_03,(HeapType)type,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar8->type).id,
               (Expression *)&local_68);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&local_68);
    pcVar3 = (this->config->importNamespace).super_IString.str._M_str;
    *(size_t *)(local_88._M_p + 0x18) = (this->config->importNamespace).super_IString.str._M_len;
    *(char **)(local_88._M_p + 0x20) = pcVar3;
    *(string_view *)(local_88._M_p + 0x28) = name_01;
    Module::addFunction(this->secondary,
                        (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &stack0xffffffffffffff78);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &stack0xffffffffffffff78);
  }
  return;
}

Assistant:

void ModuleSplitter::exportImportFunction(Name funcName) {
  Name exportName;
  // If the function is already exported, use the existing export name.
  // Otherwise, create a new export for it.
  auto exportIt = exportedPrimaryFuncs.find(funcName);
  if (exportIt != exportedPrimaryFuncs.end()) {
    exportName = exportIt->second;
  } else {
    if (config.minimizeNewExportNames) {
      do {
        exportName = config.newExportPrefix + minified.getName();
      } while (primary.getExportOrNull(exportName) != nullptr);
    } else {
      exportName = Names::getValidExportName(
        primary, config.newExportPrefix + funcName.toString());
    }
    primary.addExport(
      Builder::makeExport(exportName, funcName, ExternalKind::Function));
    exportedPrimaryFuncs[funcName] = exportName;
  }
  // Import the function if it is not already imported into the secondary
  // module.
  if (secondary.getFunctionOrNull(funcName) == nullptr) {
    auto func =
      Builder::makeFunction(funcName, primary.getFunction(funcName)->type, {});
    func->module = config.importNamespace;
    func->base = exportName;
    secondary.addFunction(std::move(func));
  }
}